

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyResolveTextureSubresourceAttribs
               (ResolveTextureSubresourceAttribs *ResolveAttribs,TextureDesc *SrcTexDesc,
               TextureDesc *DstTexDesc)

{
  TEXTURE_FORMAT TVar1;
  byte bVar2;
  TEXTURE_FORMAT TVar3;
  TextureFormatAttribs *Args_1;
  TextureFormatAttribs *Args_3;
  TextureFormatAttribs *pTVar4;
  char (*in_RCX) [102];
  char (*in_R9) [47];
  char (*Args_21) [3];
  char (*Args_5) [95];
  string msg_2;
  MipLevelProperties SrcMipLevelProps;
  MipLevelProperties DstMipLevelProps;
  
  if (SrcTexDesc->SampleCount < 2) {
    FormatString<char[50],char[17],char_const*,char[47]>
              ((string *)&SrcMipLevelProps,
               (Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])"source texture \'",(char (*) [17])SrcTexDesc,
               (char **)"\' of a resolve operation is not multi-sampled.",in_R9);
    in_RCX = (char (*) [102])0x11b;
    DebugAssertionFailed
              ((Char *)CONCAT44(SrcMipLevelProps.LogicalHeight,SrcMipLevelProps.LogicalWidth),
               "VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x11b);
    std::__cxx11::string::~string((string *)&SrcMipLevelProps);
  }
  if (DstTexDesc->SampleCount != 1) {
    FormatString<char[50],char[22],char_const*,char[43]>
              ((string *)&SrcMipLevelProps,
               (Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])"destination texture \'",(char (*) [22])DstTexDesc,
               (char **)"\' of a resolve operation is multi-sampled.",(char (*) [43])in_R9);
    in_RCX = (char (*) [102])0x11c;
    DebugAssertionFailed
              ((Char *)CONCAT44(SrcMipLevelProps.LogicalHeight,SrcMipLevelProps.LogicalWidth),
               "VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x11c);
    std::__cxx11::string::~string((string *)&SrcMipLevelProps);
  }
  GetMipLevelProperties(&SrcMipLevelProps,SrcTexDesc,ResolveAttribs->SrcMipLevel);
  Args_21 = (char (*) [3])0x5894ef;
  GetMipLevelProperties(&DstMipLevelProps,DstTexDesc,ResolveAttribs->DstMipLevel);
  if ((SrcMipLevelProps.LogicalWidth != DstMipLevelProps.LogicalWidth) ||
     (SrcMipLevelProps.LogicalHeight != DstMipLevelProps.LogicalHeight)) {
    FormatString<char[50],char[11],unsigned_int,char[2],unsigned_int,char[62],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[28],unsigned_int,char[2],unsigned_int,char[44],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[3]>
              (&msg_2,(Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])0x7e8904,(char (*) [11])&SrcMipLevelProps,(uint *)0x8008a0,
               (char (*) [2])&SrcMipLevelProps.LogicalHeight,
               (uint *)") of the source subresource of a resolve operation (texture \'",
               (char (*) [62])SrcTexDesc,(char **)"\', mip ",(char (*) [8])ResolveAttribs,
               (uint *)", slice ",(char (*) [9])&ResolveAttribs->SrcSlice,
               (uint *)") does not match the size (",(char (*) [28])&DstMipLevelProps,
               (uint *)0x8008a0,(char (*) [2])&DstMipLevelProps.LogicalHeight,
               (uint *)") of the destination subresource (texture \'",(char (*) [44])DstTexDesc,
               (char **)"\', mip ",(char (*) [8])&ResolveAttribs->DstMipLevel,(uint *)", slice ",
               (char (*) [9])&ResolveAttribs->DstSlice,(uint *)0x8019c0,Args_21);
    in_RCX = (char (*) [102])0x126;
    DebugAssertionFailed
              (msg_2._M_dataplus._M_p,"VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x126);
    std::__cxx11::string::~string((string *)&msg_2);
  }
  Args_1 = GetTextureFormatAttribs(SrcTexDesc->Format);
  Args_3 = GetTextureFormatAttribs(DstTexDesc->Format);
  Args_5 = (char (*) [95])0x5895ee;
  pTVar4 = GetTextureFormatAttribs(ResolveAttribs->Format);
  if ((Args_1->IsTypeless == false) && (Args_3->IsTypeless == false)) {
    TVar3 = SrcTexDesc->Format;
    if (TVar3 != DstTexDesc->Format) {
      FormatString<char[50],char[9],char_const*,char[20],char_const*,char[95]>
                (&msg_2,(Diligent *)"Resolve texture subresource attribs are invalid: ",
                 (char (*) [50])"source (",(char (*) [9])Args_1,(char **)") and destination (",
                 (char (*) [20])Args_3,
                 (char **)
                 ") texture formats of a resolve operation must match exactly or be compatible typeless formats."
                 ,Args_5);
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"VerifyResolveTextureSubresourceAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x12f);
      std::__cxx11::string::~string((string *)&msg_2);
      TVar3 = SrcTexDesc->Format;
    }
    TVar1 = ResolveAttribs->Format;
    in_RCX = (char (*) [102])(ulong)TVar1;
    if ((TVar1 != TEX_FORMAT_UNKNOWN) && (TVar3 != TVar1)) {
      FormatString<char[50],char[39]>
                (&msg_2,(Diligent *)"Resolve texture subresource attribs are invalid: ",
                 (char (*) [50])"Invalid format of a resolve operation.",(char (*) [39])in_RCX);
      in_RCX = (char (*) [102])0x130;
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"VerifyResolveTextureSubresourceAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x130);
      std::__cxx11::string::~string((string *)&msg_2);
    }
  }
  bVar2 = Args_1->IsTypeless;
  if ((((Bool)bVar2 == true) && (Args_3->IsTypeless == true)) &&
     (ResolveAttribs->Format == TEX_FORMAT_UNKNOWN)) {
    FormatString<char[50],char[102]>
              (&msg_2,(Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])
               "format of a resolve operation must not be unknown when both src and dst texture formats are typeless."
               ,in_RCX);
    in_RCX = (char (*) [102])0x135;
    DebugAssertionFailed
              (msg_2._M_dataplus._M_p,"VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x135);
    std::__cxx11::string::~string((string *)&msg_2);
    bVar2 = Args_1->IsTypeless;
  }
  if ((((bVar2 & 1) != 0) || (Args_3->IsTypeless == true)) && (pTVar4->IsTypeless == true)) {
    FormatString<char[50],char[96]>
              (&msg_2,(Diligent *)"Resolve texture subresource attribs are invalid: ",
               (char (*) [50])
               "format of a resolve operation must not be typeless when one of the texture formats is typeless."
               ,(char (*) [96])in_RCX);
    DebugAssertionFailed
              (msg_2._M_dataplus._M_p,"VerifyResolveTextureSubresourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x13a);
    std::__cxx11::string::~string((string *)&msg_2);
  }
  return true;
}

Assistant:

bool VerifyResolveTextureSubresourceAttribs(const ResolveTextureSubresourceAttribs& ResolveAttribs,
                                            const TextureDesc&                      SrcTexDesc,
                                            const TextureDesc&                      DstTexDesc)
{
#define CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Resolve texture subresource attribs are invalid: ", __VA_ARGS__)

    CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(SrcTexDesc.SampleCount > 1, "source texture '", SrcTexDesc.Name, "' of a resolve operation is not multi-sampled.");
    CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(DstTexDesc.SampleCount == 1, "destination texture '", DstTexDesc.Name, "' of a resolve operation is multi-sampled.");

    MipLevelProperties SrcMipLevelProps = GetMipLevelProperties(SrcTexDesc, ResolveAttribs.SrcMipLevel);
    MipLevelProperties DstMipLevelProps = GetMipLevelProperties(DstTexDesc, ResolveAttribs.DstMipLevel);
    CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(SrcMipLevelProps.LogicalWidth == DstMipLevelProps.LogicalWidth && SrcMipLevelProps.LogicalHeight == DstMipLevelProps.LogicalHeight,
                                     "the size (", SrcMipLevelProps.LogicalWidth, "x", SrcMipLevelProps.LogicalHeight,
                                     ") of the source subresource of a resolve operation (texture '",
                                     SrcTexDesc.Name, "', mip ", ResolveAttribs.SrcMipLevel, ", slice ", ResolveAttribs.SrcSlice,
                                     ") does not match the size (", DstMipLevelProps.LogicalWidth, "x", DstMipLevelProps.LogicalHeight,
                                     ") of the destination subresource (texture '", DstTexDesc.Name, "', mip ", ResolveAttribs.DstMipLevel, ", slice ",
                                     ResolveAttribs.DstSlice, ").");

    const TextureFormatAttribs& SrcFmtAttribs     = GetTextureFormatAttribs(SrcTexDesc.Format);
    const TextureFormatAttribs& DstFmtAttribs     = GetTextureFormatAttribs(DstTexDesc.Format);
    const TextureFormatAttribs& ResolveFmtAttribs = GetTextureFormatAttribs(ResolveAttribs.Format);
    if (!SrcFmtAttribs.IsTypeless && !DstFmtAttribs.IsTypeless)
    {
        CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(SrcTexDesc.Format == DstTexDesc.Format,
                                         "source (", SrcFmtAttribs.Name, ") and destination (", DstFmtAttribs.Name,
                                         ") texture formats of a resolve operation must match exactly or be compatible typeless formats.");
        CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(ResolveAttribs.Format == TEX_FORMAT_UNKNOWN || SrcTexDesc.Format == ResolveAttribs.Format, "Invalid format of a resolve operation.");
    }
    if (SrcFmtAttribs.IsTypeless && DstFmtAttribs.IsTypeless)
    {
        CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(ResolveAttribs.Format != TEX_FORMAT_UNKNOWN,
                                         "format of a resolve operation must not be unknown when both src and dst texture formats are typeless.");
    }
    if (SrcFmtAttribs.IsTypeless || DstFmtAttribs.IsTypeless)
    {
        CHECK_RESOLVE_TEX_SUBRES_ATTRIBS(!ResolveFmtAttribs.IsTypeless,
                                         "format of a resolve operation must not be typeless when one of the texture formats is typeless.");
    }
#undef CHECK_RESOLVE_TEX_SUBRES_ATTRIBS

    return true;
}